

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateFeatureDescription
                   (Result *__return_storage_ptr__,FeatureDescription *desc,int modelVersion,
                   bool isInput)

{
  uint32 uVar1;
  FeatureType *this;
  Rep *pRVar2;
  ulong __val;
  ArrayFeatureType_Shape *this_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ArrayFeatureType *pAVar6;
  ArrayFeatureType *pAVar7;
  ArrayFeatureType_EnumeratedShapes *pAVar8;
  ImageFeatureType *pIVar9;
  ImageFeatureType_EnumeratedImageSizes *pIVar10;
  DictionaryFeatureType *pDVar11;
  SequenceFeatureType *pSVar12;
  string *psVar13;
  Type *pTVar14;
  ImageFeatureType_ImageSizeRange *pIVar15;
  ArrayFeatureType_EnumeratedShapes *pAVar16;
  long *plVar17;
  int64 iVar18;
  Type *pTVar19;
  void **ppvVar20;
  long lVar21;
  SizeRange *range;
  Result *pRVar22;
  Result *this_01;
  int d;
  int iVar23;
  RepeatedField<long> *pRVar24;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *this_02;
  ulong uVar25;
  Result res;
  undefined1 local_140 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  Result *local_f8;
  ArrayFeatureType_EnumeratedShapes *local_f0;
  string local_e8;
  SizeRange *local_c8;
  string local_c0;
  SizeRange *local_a0;
  string local_98;
  string local_78;
  string local_58;
  ArrayFeatureType_EnumeratedShapes *local_38;
  
  pRVar22 = &res;
  this_01 = &res;
  bVar3 = std::operator==((desc->name_).ptr_,"");
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&res,"Feature description must have a non-empty name.",
               (allocator<char> *)local_140);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    goto LAB_00224875;
  }
  this = desc->type_;
  if (desc == (FeatureDescription *)&Specification::_FeatureDescription_default_instance_ ||
      this == (FeatureType *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "Feature description ",(desc->name_).ptr_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   " must specify a valid feature type.");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    goto LAB_00224868;
  }
  switch(this->_oneof_case_[0]) {
  case 0:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "Feature description has an unspecified or invalid type for feature \'",
                   (desc->name_).ptr_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "\'.");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    break;
  default:
    goto switchD_002247e8_caseD_1;
  case 4:
    pIVar9 = Specification::FeatureType::imagetype(this);
    __val = pIVar9->width_;
    pIVar9 = Specification::FeatureType::imagetype(this);
    local_f0 = (ArrayFeatureType_EnumeratedShapes *)pIVar9->height_;
    bVar3 = 0 < (long)local_f0;
    uVar25 = __val;
    if (2 < modelVersion) {
      pIVar9 = Specification::FeatureType::imagetype(this);
      if (pIVar9->_oneof_case_[0] == 0x1f) {
        local_f8 = __return_storage_ptr__;
        pIVar9 = Specification::FeatureType::imagetype(this);
        pIVar15 = Specification::ImageFeatureType::imagesizerange(pIVar9);
        local_a0 = pIVar15->widthrange_;
        if (local_a0 == (SizeRange *)0x0) {
          local_a0 = (SizeRange *)&Specification::_SizeRange_default_instance_;
        }
        validateSizeRange(&res,local_a0);
        bVar4 = Result::good(&res);
        pRVar22 = local_f8;
        if (bVar4) {
          pIVar9 = Specification::FeatureType::imagetype(this);
          pIVar15 = Specification::ImageFeatureType::imagesizerange(pIVar9);
          local_c8 = pIVar15->heightrange_;
          if (local_c8 == (SizeRange *)0x0) {
            local_c8 = (SizeRange *)&Specification::_SizeRange_default_instance_;
          }
          validateSizeRange((Result *)local_140,local_c8);
          Result::operator=(&res,(Result *)local_140);
          std::__cxx11::string::~string((string *)(local_140 + 8));
          bVar4 = Result::good(&res);
          pRVar22 = local_f8;
          if (!bVar4) {
            std::operator+(&local_e8,"Description of image feature \'",(desc->name_).ptr_);
            std::operator+(&local_118,&local_e8,"\' has an invalid flexible height range. ");
            psVar13 = Result::message_abi_cxx11_(&res);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_140,&local_118,psVar13);
            Result::Result(pRVar22,INVALID_MODEL_INTERFACE,(string *)local_140);
            goto LAB_00225609;
          }
          uVar25 = local_a0->lowerbound_;
          if (0 < (long)__val && bVar3) {
            if (((long)__val < (long)uVar25) ||
               ((-1 < local_a0->upperbound_ && ((ulong)local_a0->upperbound_ < __val)))) {
              std::operator+(&local_c0,"Description of image feature \'",(desc->name_).ptr_);
              std::operator+(&local_e8,&local_c0,"\' default width ");
              std::__cxx11::to_string(&local_98,__val);
              std::operator+(&local_118,&local_e8,&local_98);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_140,&local_118," is not within specified flexible width range");
              Result::Result(pRVar22,INVALID_MODEL_INTERFACE,(string *)local_140);
            }
            else {
              if ((long)local_c8->lowerbound_ <= (long)local_f0) {
                bVar3 = true;
                uVar25 = __val;
                if (((long)((ShapeFlexibilityUnion *)&local_c8->upperbound_)->enumeratedshapes_ < 0)
                   || (local_f0 <=
                       ((ShapeFlexibilityUnion *)&local_c8->upperbound_)->enumeratedshapes_))
                goto LAB_0022562c;
              }
              std::operator+(&local_c0,"Description of image feature \'",(desc->name_).ptr_);
              std::operator+(&local_e8,&local_c0,"\' default height ");
              pRVar22 = local_f8;
              std::__cxx11::to_string(&local_98,(long)local_f0);
              std::operator+(&local_118,&local_e8,&local_98);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_140,&local_118," is not within specified flexible height range");
              Result::Result(pRVar22,INVALID_MODEL_INTERFACE,(string *)local_140);
            }
            std::__cxx11::string::~string((string *)local_140);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::~string((string *)&local_e8);
            psVar13 = &local_c0;
            goto LAB_00225625;
          }
          local_f0 = (ArrayFeatureType_EnumeratedShapes *)local_c8->lowerbound_;
          bVar3 = true;
        }
        else {
          std::operator+(&local_e8,"Description of image feature \'",(desc->name_).ptr_);
          std::operator+(&local_118,&local_e8,"\' has an invalid flexible width range. ");
          psVar13 = Result::message_abi_cxx11_(&res);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,&local_118,psVar13);
          Result::Result(pRVar22,INVALID_MODEL_INTERFACE,(string *)local_140);
LAB_00225609:
          std::__cxx11::string::~string((string *)local_140);
          std::__cxx11::string::~string((string *)&local_118);
          psVar13 = &local_e8;
LAB_00225625:
          std::__cxx11::string::~string((string *)psVar13);
          bVar3 = false;
          uVar25 = __val;
        }
LAB_0022562c:
        std::__cxx11::string::~string((string *)&res.m_message);
        __return_storage_ptr__ = local_f8;
        if (!bVar3) {
          return local_f8;
        }
      }
      else if (pIVar9->_oneof_case_[0] == 0x15) {
        pIVar9 = Specification::FeatureType::imagetype(this);
        pIVar10 = Specification::ImageFeatureType::enumeratedsizes(pIVar9);
        if ((pIVar10->sizes_).super_RepeatedPtrFieldBase.current_size_ == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"Description of image feature \'",(desc->name_).ptr_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"\' has enumerated zero permitted sizes.");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
          break;
        }
        pIVar9 = Specification::FeatureType::imagetype(this);
        pIVar10 = Specification::ImageFeatureType::enumeratedsizes(pIVar9);
        if (0 < (long)__val && bVar3) {
          pRVar2 = (pIVar10->sizes_).super_RepeatedPtrFieldBase.rep_;
          ppvVar20 = pRVar2->elements;
          if (pRVar2 == (Rep *)0x0) {
            ppvVar20 = (void **)0x0;
          }
          for (lVar21 = 0;
              (long)(pIVar10->sizes_).super_RepeatedPtrFieldBase.current_size_ * 8 != lVar21;
              lVar21 = lVar21 + 8) {
            if ((__val == *(ulong *)(*(long *)((long)ppvVar20 + lVar21) + 0x10)) &&
               (local_f0 ==
                *(ArrayFeatureType_EnumeratedShapes **)(*(long *)((long)ppvVar20 + lVar21) + 0x18)))
            goto LAB_00225643;
          }
          std::operator+(&local_98,"Description of image feature \'",(desc->name_).ptr_);
          std::operator+(&local_c0,&local_98,"\' has a default size of ");
          std::__cxx11::to_string(&local_78,__val);
          std::operator+(&local_e8,&local_c0,&local_78);
          std::operator+(&local_118,&local_e8,anon_var_dwarf_3864bc);
          std::__cxx11::to_string(&local_58,(long)local_f0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,&local_118,&local_58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140," which is not within the allowed enumerated sizes specified.");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
          goto LAB_00225a9f;
        }
        pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                            (&(pIVar10->sizes_).super_RepeatedPtrFieldBase,0);
        uVar25 = pTVar19->width_;
        pIVar9 = Specification::FeatureType::imagetype(this);
        pIVar10 = Specification::ImageFeatureType::enumeratedsizes(pIVar9);
        pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                            (&(pIVar10->sizes_).super_RepeatedPtrFieldBase,0);
        local_f0 = (ArrayFeatureType_EnumeratedShapes *)pTVar19->height_;
      }
    }
LAB_00225643:
    if ((long)uVar25 < 1) {
      std::operator+(&local_e8,"Description of image feature \'",(desc->name_).ptr_);
      std::operator+(&local_118,&local_e8,"\' has missing or non-positive width ");
      pIVar9 = Specification::FeatureType::imagetype(this);
      std::__cxx11::to_string(&local_c0,pIVar9->width_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     &local_118,&local_c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     ".");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    }
    else {
      if (0 < (long)local_f0) {
        pIVar9 = Specification::FeatureType::imagetype(this);
        iVar23 = pIVar9->colorspace_;
        if (((iVar23 == 10) || (iVar23 == 0x14)) || (iVar23 == 0x1e)) goto switchD_002247e8_caseD_1;
        if (iVar23 != 0x28) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"Description of image feature \'",(desc->name_).ptr_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,
                         "\' has missing or invalid colorspace. It must be RGB, BGR or GRAYSCALE.");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
          break;
        }
        if (6 < modelVersion) goto switchD_002247e8_caseD_1;
        std::__cxx11::to_string(&local_118,7);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,&local_118,". This model has version ");
        std::__cxx11::to_string(&local_e8,modelVersion);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,&local_e8);
        std::operator+(&local_98,"Description of image feature \'",(desc->name_).ptr_);
        std::operator+(&local_c0,&local_98,
                       "\' has GRAYSCALE_FLOAT16 colorspace, which is only valid in specification version >= "
                      );
        psVar13 = (string *)std::__cxx11::string::append((string *)&local_c0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,psVar13);
LAB_00225730:
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&res);
        this_01 = (Result *)&local_e8;
LAB_0022575a:
        std::__cxx11::string::~string((string *)this_01);
        std::__cxx11::string::~string((string *)local_140);
        pRVar22 = (Result *)&local_118;
        goto LAB_00224875;
      }
      std::operator+(&local_e8,"Description of image feature \'",(desc->name_).ptr_);
      std::operator+(&local_118,&local_e8,"\' has missing or non-positive height ");
      pIVar9 = Specification::FeatureType::imagetype(this);
      std::__cxx11::to_string(&local_c0,pIVar9->height_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     &local_118,&local_c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     ".");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    }
    std::__cxx11::string::~string((string *)&res);
    std::__cxx11::string::~string((string *)local_140);
    psVar13 = &local_c0;
    goto LAB_002258a0;
  case 5:
    pAVar6 = Specification::FeatureType::multiarraytype(this);
    pAVar7 = Specification::FeatureType::multiarraytype(this);
    local_a0 = (SizeRange *)CONCAT44(local_a0._4_4_,(pAVar7->shape_).current_size_);
    if (modelVersion < 3) {
LAB_00224af6:
      local_f8 = __return_storage_ptr__;
      if (isInput && (int)local_a0 == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,"Description of multiarray feature \'",(desc->name_).ptr_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,"\' has missing shape constraints.");
        __return_storage_ptr__ = local_f8;
        Result::Result(local_f8,INVALID_MODEL_INTERFACE,(string *)&res);
        break;
      }
LAB_002251f9:
      if ((int)local_a0 != 0) {
        for (iVar23 = 0; pAVar6 = Specification::FeatureType::multiarraytype(this),
            iVar23 < (pAVar6->shape_).current_size_; iVar23 = iVar23 + 1) {
          pAVar6 = Specification::FeatureType::multiarraytype(this);
          iVar18 = Specification::ArrayFeatureType::shape(pAVar6,iVar23);
          if (iVar18 < 0) {
            std::operator+(&local_98,"Description of multiarray feature \'",(desc->name_).ptr_);
            std::operator+(&local_c0,&local_98,"\' has an invalid shape. Element ");
            std::__cxx11::to_string(&local_78,iVar23);
            __return_storage_ptr__ = local_f8;
            std::operator+(&local_e8,&local_c0,&local_78);
            std::operator+(&local_118,&local_e8," has non-positive value ");
            std::__cxx11::to_string(&local_58,iVar18);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_140,&local_118,&local_58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_140,".");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
            goto LAB_00225a9f;
          }
        }
      }
    }
    else {
      pRVar24 = &pAVar6->shape_;
      pAVar6 = Specification::FeatureType::multiarraytype(this);
      if (pAVar6->_oneof_case_[0] != 0x1f) {
        if (pAVar6->_oneof_case_[0] == 0x15) {
          pAVar6 = Specification::FeatureType::multiarraytype(this);
          pAVar8 = Specification::ArrayFeatureType::enumeratedshapes(pAVar6);
          if ((pAVar8->shapes_).super_RepeatedPtrFieldBase.current_size_ != 0) {
            pAVar6 = Specification::FeatureType::multiarraytype(this);
            pAVar8 = Specification::ArrayFeatureType::enumeratedshapes(pAVar6);
            pRVar2 = (pAVar8->shapes_).super_RepeatedPtrFieldBase.rep_;
            ppvVar20 = pRVar2->elements;
            if (pRVar2 == (Rep *)0x0) {
              ppvVar20 = (void **)0x0;
            }
            lVar21 = 0;
LAB_00224919:
            if ((long)(pAVar8->shapes_).super_RepeatedPtrFieldBase.current_size_ * 8 != lVar21)
            goto code_r0x00224922;
            local_f8 = __return_storage_ptr__;
            local_c8 = (SizeRange *)pRVar24;
            if ((int)local_a0 != 0) {
              pAVar6 = Specification::FeatureType::multiarraytype(this);
              pAVar16 = Specification::ArrayFeatureType::enumeratedshapes(pAVar6);
              pRVar2 = (pAVar16->shapes_).super_RepeatedPtrFieldBase.rep_;
              pAVar8 = (ArrayFeatureType_EnumeratedShapes *)pRVar2->elements;
              if (pRVar2 == (Rep *)0x0) {
                pAVar8 = (ArrayFeatureType_EnumeratedShapes *)0x0;
              }
              local_38 = (ArrayFeatureType_EnumeratedShapes *)
                         (&pAVar8->super_MessageLite +
                         (pAVar16->shapes_).super_RepeatedPtrFieldBase.current_size_);
              while (pAVar8 != local_38) {
                this_00 = (ArrayFeatureType_Shape *)(pAVar8->super_MessageLite)._vptr_MessageLite;
                local_f0 = pAVar8;
                if ((this_00->shape_).current_size_ ==
                    *(int *)&(local_c8->super_MessageLite)._vptr_MessageLite) {
                  iVar23 = 0;
                  do {
                    if ((this_00->shape_).current_size_ <= iVar23) goto LAB_002251f9;
                    plVar17 = google::protobuf::RepeatedField<long>::Get
                                        ((RepeatedField<long> *)local_c8,iVar23);
                    lVar21 = *plVar17;
                    iVar18 = Specification::ArrayFeatureType_Shape::shape(this_00,iVar23);
                    iVar23 = iVar23 + 1;
                  } while (lVar21 == iVar18);
                }
                pAVar8 = (ArrayFeatureType_EnumeratedShapes *)&local_f0->_internal_metadata_;
              }
              std::operator+(&local_118,"Description of multiarray feature \'",(desc->name_).ptr_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_140,&local_118,"\' has a default shape specified ");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &res,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_140,
                             " which is not within the allowed enumerated shapes specified.");
              __return_storage_ptr__ = local_f8;
              Result::Result(local_f8,INVALID_MODEL_INTERFACE,(string *)&res);
              goto LAB_0022575a;
            }
            goto LAB_00225235;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"Description of multiarray feature \'",(desc->name_).ptr_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"\' has enumerated zero permitted sizes.");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
          break;
        }
        goto LAB_00224af6;
      }
      local_f8 = __return_storage_ptr__;
      local_c8 = (SizeRange *)pRVar24;
      pAVar6 = Specification::FeatureType::multiarraytype(this);
      local_f0 = (ArrayFeatureType_EnumeratedShapes *)
                 Specification::ArrayFeatureType::shaperange(pAVar6);
      this_02 = &local_f0->shapes_;
      for (iVar23 = 0; iVar5 = (local_f0->shapes_).super_RepeatedPtrFieldBase.current_size_,
          iVar23 < iVar5; iVar23 = iVar23 + 1) {
        pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                            (&this_02->super_RepeatedPtrFieldBase,iVar23);
        validateSizeRange(&res,pTVar14);
        bVar3 = Result::good(&res);
        if (!bVar3) {
          std::operator+(&local_98,"Description of multiarray feature \'",(desc->name_).ptr_);
          std::operator+(&local_c0,&local_98,"\' has an invalid range for dimension ");
          __return_storage_ptr__ = local_f8;
          std::__cxx11::to_string(&local_78,iVar23);
          std::operator+(&local_e8,&local_c0,&local_78);
          std::operator+(&local_118,&local_e8,". ");
          psVar13 = Result::message_abi_cxx11_(&res);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,&local_118,psVar13);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_140);
          std::__cxx11::string::~string((string *)local_140);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_c0);
          psVar13 = &local_98;
          goto LAB_002250bb;
        }
        std::__cxx11::string::~string((string *)&res.m_message);
      }
      if ((int)local_a0 != 0) {
        if (*(int *)&(local_c8->super_MessageLite)._vptr_MessageLite != iVar5) {
          std::operator+(&local_98,"Description of multiarray feature \'",(desc->name_).ptr_);
          std::operator+(&local_c0,&local_98,"\' has a default ");
          std::__cxx11::to_string
                    (&local_78,*(int *)&(local_c8->super_MessageLite)._vptr_MessageLite);
          __return_storage_ptr__ = local_f8;
          std::operator+(&local_e8,&local_c0,&local_78);
          std::operator+(&local_118,&local_e8,"-d shape but a ");
          std::__cxx11::to_string
                    (&local_58,(local_f0->shapes_).super_RepeatedPtrFieldBase.current_size_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,&local_118,&local_58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"-d shape range");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
LAB_00225a9f:
          std::__cxx11::string::~string((string *)&res);
          std::__cxx11::string::~string((string *)local_140);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_c0);
          pRVar22 = (Result *)&local_98;
          goto LAB_00224875;
        }
        for (iVar23 = 0; iVar23 < iVar5; iVar23 = iVar23 + 1) {
          plVar17 = google::protobuf::RepeatedField<long>::Get
                              ((RepeatedField<long> *)local_c8,iVar23);
          lVar21 = *plVar17;
          pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                              (&this_02->super_RepeatedPtrFieldBase,iVar23);
          if (lVar21 < (int)pTVar14->lowerbound_) {
LAB_00225b17:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_140,"Description of multiarray feature \'",(desc->name_).ptr_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_140,
                           "\' has a default shape that is out of the specified shape range");
            __return_storage_ptr__ = local_f8;
            Result::Result(local_f8,INVALID_MODEL_INTERFACE,(string *)&res);
            goto LAB_00224868;
          }
          pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                              (&this_02->super_RepeatedPtrFieldBase,iVar23);
          if (-1 < pTVar14->upperbound_) {
            plVar17 = google::protobuf::RepeatedField<long>::Get
                                ((RepeatedField<long> *)local_c8,iVar23);
            lVar21 = *plVar17;
            pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                (&this_02->super_RepeatedPtrFieldBase,iVar23);
            if (pTVar14->upperbound_ < lVar21) goto LAB_00225b17;
          }
          iVar5 = (local_f0->shapes_).super_RepeatedPtrFieldBase.current_size_;
        }
        goto LAB_002251f9;
      }
    }
LAB_00225235:
    pAVar6 = Specification::FeatureType::multiarraytype(this);
    __return_storage_ptr__ = local_f8;
    iVar23 = pAVar6->datatype_;
    if (((iVar23 != 0x20020) && (iVar23 != 0x10020)) && (iVar23 != 0x10040)) {
      if (iVar23 != 0x10010) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,"Description of multiarray feature \'",(desc->name_).ptr_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,
                       "\' has an invalid or unspecified dataType. It must be specified as DOUBLE, FLOAT32, FLOAT16 or INT32"
                      );
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
        break;
      }
      if (modelVersion < 7) {
        std::__cxx11::to_string(&local_118,7);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,&local_118,". This model has version ");
        std::__cxx11::to_string(&local_e8,modelVersion);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,&local_e8);
        std::operator+(&local_98,"Description of multiarray feature \'",(desc->name_).ptr_);
        std::operator+(&local_c0,&local_98,
                       "\' has FLOAT16 dataType, which is only valid in specification version >= ");
        psVar13 = (string *)std::__cxx11::string::append((string *)&local_c0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,psVar13);
        goto LAB_00225730;
      }
    }
    pAVar6 = Specification::FeatureType::multiarraytype(this);
    uVar1 = pAVar6->_oneof_case_[1];
    if (uVar1 == 0x29) {
      pAVar6 = Specification::FeatureType::multiarraytype(this);
      if (pAVar6->datatype_ == 0x20020) goto switchD_002247e8_caseD_1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "Description of multiarray feature \'",(desc->name_).ptr_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "\' has mistmatch between dataType and the type of default optional value.");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    }
    else if (uVar1 == 0x33) {
      pAVar6 = Specification::FeatureType::multiarraytype(this);
      if ((pAVar6->datatype_ == 0x10020) ||
         (pAVar6 = Specification::FeatureType::multiarraytype(this), pAVar6->datatype_ == 0x10010))
      goto switchD_002247e8_caseD_1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "Description of multiarray feature \'",(desc->name_).ptr_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "\' has mistmatch between dataType and the type of default optional value.");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    }
    else {
      if ((uVar1 != 0x3d) ||
         (pAVar6 = Specification::FeatureType::multiarraytype(this), pAVar6->datatype_ == 0x10040))
      {
switchD_002247e8_caseD_1:
        Result::Result(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "Description of multiarray feature \'",(desc->name_).ptr_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "\' has mistmatch between dataType and the type of default optional value.");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    }
    break;
  case 6:
    pDVar11 = Specification::FeatureType::dictionarytype(this);
    if (pDVar11->_oneof_case_[0] != 0) goto switchD_002247e8_caseD_1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "Description of dictionary feature \'",(desc->name_).ptr_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "\' must contain a key type of either Int64 or String.");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    break;
  case 7:
    if (2 < modelVersion) {
      pSVar12 = Specification::FeatureType::sequencetype(this);
      range = pSVar12->sizerange_;
      if (range == (SizeRange *)0x0) {
        range = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      validateSizeRange(&res,range);
      bVar3 = Result::good(&res);
      if (bVar3) {
        pSVar12 = Specification::FeatureType::sequencetype(this);
        if (pSVar12->_oneof_case_[0] != 0) {
          std::__cxx11::string::~string((string *)&res.m_message);
          goto switchD_002247e8_caseD_1;
        }
        std::operator+(&local_118,"Description of sequence feature \'",(desc->name_).ptr_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,&local_118,
                       "\' has invalid or missing type. Only Int64 and String sequences are currently supported"
                      );
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_140);
        std::__cxx11::string::~string((string *)local_140);
        psVar13 = &local_118;
      }
      else {
        std::operator+(&local_e8,"Description of sequence feature \'",(desc->name_).ptr_);
        std::operator+(&local_118,&local_e8,"\' has invalid allowed sizes. ");
        psVar13 = Result::message_abi_cxx11_(&res);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,&local_118,psVar13);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_140);
        std::__cxx11::string::~string((string *)local_140);
        std::__cxx11::string::~string((string *)&local_118);
        psVar13 = &local_e8;
      }
LAB_002250bb:
      std::__cxx11::string::~string((string *)psVar13);
      pRVar22 = (Result *)&res.m_message;
      goto LAB_00224875;
    }
    std::__cxx11::to_string(&local_e8,3);
    std::operator+(&local_118,"Sequence types are only valid in specification verison >= ",&local_e8
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   &local_118,". This model has version ");
    std::__cxx11::to_string(&local_c0,modelVersion);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   &local_c0);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
    std::__cxx11::string::~string((string *)&res);
    std::__cxx11::string::~string((string *)&local_c0);
    psVar13 = (string *)local_140;
LAB_002258a0:
    std::__cxx11::string::~string((string *)psVar13);
    std::__cxx11::string::~string((string *)&local_118);
    pRVar22 = (Result *)&local_e8;
    goto LAB_00224875;
  }
LAB_00224868:
  std::__cxx11::string::~string((string *)&res);
  pRVar22 = (Result *)local_140;
LAB_00224875:
  std::__cxx11::string::~string((string *)pRVar22);
  return __return_storage_ptr__;
code_r0x00224922:
  plVar17 = (long *)((long)ppvVar20 + lVar21);
  lVar21 = lVar21 + 8;
  if (*(int *)(*plVar17 + 0x10) == 0) goto code_r0x00224930;
  goto LAB_00224919;
code_r0x00224930:
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 "Description of multiarray feature \'",(desc->name_).ptr_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 "\' has enumerated shapes with zero dimensions.");
  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&res);
  goto LAB_00224868;
}

Assistant:

Result validateFeatureDescription(const Specification::FeatureDescription& desc, int modelVersion, bool isInput) {
        if (desc.name() == "") {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description must have a non-empty name.");
        }

        if (!desc.has_type()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description " + desc.name() + " must specify a valid feature type.");
        }

        const auto& type = desc.type();
        switch (type.Type_case()) {
            case Specification::FeatureType::kDoubleType:
            case Specification::FeatureType::kInt64Type:
            case Specification::FeatureType::kStringType:
                // in general, non-parametric types need no further validation
                break;

            case Specification::FeatureType::kMultiArrayType:
            {
                const auto &defaultShape = type.multiarraytype().shape();
                bool hasExplicitDefault = (type.multiarraytype().shape_size() != 0);
                bool hasImplictDefault = false;
                // Newer versions use the updated shape constraints for images and multi-arrays
                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.multiarraytype().ShapeFlexibility_case()) {

                        case Specification::ArrayFeatureType::kEnumeratedShapes: {

                            hasImplictDefault = true;

                            if (type.multiarraytype().enumeratedshapes().shapes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() == 0) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() + "' has enumerated shapes with zero dimensions.");
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() != defaultShape.size()) { continue; }
                                foundDefault = true;
                                for (int d = 0; d < shape.shape_size(); d++) {
                                    if (defaultShape[d] != shape.shape(d)) { foundDefault = false; break; }
                                }
                                if (foundDefault) { break; }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has a default shape specified " +
                                              " which is not within the allowed enumerated shapes specified.");
                            }

                            break;
                        }
                        case Specification::ArrayFeatureType::kShapeRange: {

                            hasImplictDefault = true;

                            const auto& sizeRanges = type.multiarraytype().shaperange().sizeranges();
                            for (int i = 0; i < sizeRanges.size(); i++) {
                                const auto &range = sizeRanges[i];
                                Result res = validateSizeRange(range);
                                if (!res.good()) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() +
                                                  "' has an invalid range for dimension " + std::to_string(i) + ". " +
                                                  res.message());
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            // Check if default is compatible
                            if (defaultShape.size() != sizeRanges.size()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() +
                                              "' has a default " + std::to_string(defaultShape.size()) + "-d shape but a " +
                                              std::to_string(sizeRanges.size()) + "-d shape range");
                            }

                             for (int i = 0; i < sizeRanges.size(); i++) {
                                 if (defaultShape[i] < (int)sizeRanges[i].lowerbound() ||
                                     (sizeRanges[i].upperbound() >= 0 && defaultShape[i] > sizeRanges[i].upperbound())) {

                                     return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                   "Description of multiarray feature '" + desc.name() +
                                                   "' has a default shape that is out of the specified shape range");
                                 }
                             }

                            break;
                        }
                        case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                            break;
                    }

                }

                if (isInput && !hasExplicitDefault && !hasImplictDefault) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of multiarray feature '" + desc.name() + "' has missing shape constraints.");
                }

                if (hasExplicitDefault) {
                    for (int i=0; i < type.multiarraytype().shape_size(); i++) {
                        const auto &value = type.multiarraytype().shape(i);
                        if (value < 0) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has an invalid shape. "
                                          "Element " + std::to_string(i) + " has non-positive value " + std::to_string(value) + ".");
                        }
                    }
                }

                switch (type.multiarraytype().datatype()) {
                    case Specification::ArrayFeatureType_ArrayDataType_DOUBLE:
                    case Specification::ArrayFeatureType_ArrayDataType_FLOAT32:
                    case Specification::ArrayFeatureType_ArrayDataType_INT32:
                        break;
                    case Specification::ArrayFeatureType_ArrayDataType_FLOAT16:
                        if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS16) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() +
                                          "' has FLOAT16 dataType, which is only valid in specification version >= " += std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS16)+
                                          ". This model has version " + std::to_string(modelVersion));
                        }

                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of multiarray feature '" + desc.name() + "' has an invalid or unspecified dataType. "
                                      "It must be specified as DOUBLE, FLOAT32, FLOAT16 or INT32");
                }

                switch (type.multiarraytype().defaultOptionalValue_case()) {
                    case CoreML::Specification::ArrayFeatureType::kDoubleDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_DOUBLE){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kFloatDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32 &&
                            type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT16){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kIntDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_INT32){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    default:
                        break;
                }
                
                break;

            }
            case Specification::FeatureType::kDictionaryType:
                switch (type.dictionarytype().KeyType_case()) {
                    case Specification::DictionaryFeatureType::KeyTypeCase::kInt64KeyType:
                    case Specification::DictionaryFeatureType::KeyTypeCase::kStringKeyType:
                        break;
                    case Specification::DictionaryFeatureType::KeyTypeCase::KEYTYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of dictionary feature '" + desc.name() + "' must contain a key type of either Int64 or String.");
                }
                break;

            case Specification::FeatureType::kImageType: {

                int64_t defaultWidth = type.imagetype().width();
                int64_t defaultHeight = type.imagetype().height();
                bool hasDefault = (defaultWidth > 0 && defaultHeight > 0);

                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.imagetype().SizeFlexibility_case()) {

                        case Specification::ImageFeatureType::kEnumeratedSizes: {

                            if (type.imagetype().enumeratedsizes().sizes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)type.imagetype().enumeratedsizes().sizes(0).width();
                                defaultHeight = (int64_t)type.imagetype().enumeratedsizes().sizes(0).height();
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &size : type.imagetype().enumeratedsizes().sizes()) {
                                if (defaultWidth == (int64_t)size.width() && defaultHeight == (int64_t)size.height()) {
                                    foundDefault = true;
                                    break;
                                }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has a default size of " +
                                              std::to_string(defaultWidth) + " × " + std::to_string(defaultHeight) +
                                              " which is not within the allowed enumerated sizes specified.");
                            }

                            break;
                        }
                        case Specification::ImageFeatureType::kImageSizeRange:
                        {
                            const auto& widthRange = type.imagetype().imagesizerange().widthrange();
                            Result res = validateSizeRange(widthRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible width range. "
                                               + res.message());
                            }

                            const auto& heightRange = type.imagetype().imagesizerange().heightrange();
                            res = validateSizeRange(heightRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible height range. "
                                              + res.message());
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)widthRange.lowerbound();
                                defaultHeight = (int64_t)heightRange.lowerbound();
                                break;
                            }

                            if (defaultWidth < (int64_t)widthRange.lowerbound() ||
                                (widthRange.upperbound() >=0 && defaultWidth > widthRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default width "
                                              + std::to_string(defaultWidth) + " is not within specified flexible width range");
                            }

                            if (defaultHeight < (int64_t)heightRange.lowerbound() ||
                                (heightRange.upperbound() >=0 && defaultHeight > heightRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default height "
                                              + std::to_string(defaultHeight) + " is not within specified flexible height range");
                            }


                            break;
                        }
                        default:
                            break;
                    }

                }

                if (defaultWidth <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive width " + std::to_string(type.imagetype().width()) + ".");
                }

                if (defaultHeight <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive height " + std::to_string(type.imagetype().height()) + ".");
                }

                switch (type.imagetype().colorspace()) {
                    case Specification::ImageFeatureType_ColorSpace_GRAYSCALE:
                    case Specification::ImageFeatureType_ColorSpace_RGB:
                    case Specification::ImageFeatureType_ColorSpace_BGR:
                        break;
                    case Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16:
                        if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS16) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of image feature '" + desc.name() +
                                          "' has GRAYSCALE_FLOAT16 colorspace, which is only valid in specification version >= " += std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS16)+
                                          ". This model has version " + std::to_string(modelVersion));
                        }
                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of image feature '" + desc.name() +
                                      "' has missing or invalid colorspace. It must be RGB, BGR or GRAYSCALE.");
                }
                break;
            }
            case Specification::FeatureType::kSequenceType: {

                if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS12) {
                    return  Result(ResultType::INVALID_MODEL_INTERFACE,
                                   "Sequence types are only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS12)+
                                   ". This model has version " + std::to_string(modelVersion));
                }

                // Validate size
                Result res = validateSizeRange(type.sequencetype().sizerange());
                if (!res.good()) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of sequence feature '" + desc.name() + "' has invalid allowed sizes. "
                                  + res.message());
                }

                // Validate type

                switch (type.sequencetype().Type_case()) {
                    case Specification::SequenceFeatureType::kInt64Type:
                    case Specification::SequenceFeatureType::kStringType:
                        break;
                    case Specification::SequenceFeatureType::TYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of sequence feature '" + desc.name() + "' has invalid or missing type. "
                                      "Only Int64 and String sequences are currently supported");


                }
                break;
            }
            case Specification::FeatureType::TYPE_NOT_SET:
                // these aren't equal to anything, even themselves
                return Result(ResultType::INVALID_MODEL_INTERFACE,
                              "Feature description has an unspecified or invalid type for feature '" + desc.name() + "'.");
        }

        // If we got here, the feature description is valid.
        return Result();
    }